

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O3

void __thiscall trng::negative_binomial_dist::param_type::calc_probabilities(param_type *this)

{
  pointer pdVar1;
  iterator iVar2;
  int x;
  double p;
  double local_30;
  double local_28;
  
  pdVar1 = (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  local_30 = 0.0;
  x = 0;
  do {
    local_30 = cdf(this,x);
    iVar2._M_current =
         (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->P_,iVar2,&local_30);
    }
    else {
      *iVar2._M_current = local_30;
      (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar2._M_current + 1;
    }
    x = x + 1;
  } while (local_30 < 0.999755859375);
  local_28 = 1.0;
  iVar2._M_current =
       (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->P_,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = 1.0;
    (this->P_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void calc_probabilities() {
        P_ = std::vector<double>();
        int x{0};
        double p{0.0};
        while (p < 1.0 - 1.0 / 4096.0) {
          p = cdf(x);
          P_.push_back(p);
          ++x;
        }
        P_.push_back(1);
      }